

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::to_string<char[1],std::__cxx11::string>
          (string *__return_storage_ptr__,lest *this,char (*lhs) [1],string *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  ostream *poVar1;
  char **txt;
  ostringstream os;
  string local_1e0;
  lest *local_1c0;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1c0 = this;
  to_string_abi_cxx11_(&local_1b8,(lest *)&local_1c0,txt);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string(&local_1e0,op);
  std::operator<<(poVar1,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}